

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeReturn(TranslateToFuzzReader *this,Type type)

{
  Expression *value;
  Return *pRVar1;
  ulong extraout_RDX;
  Type type_00;
  
  wasm::HeapType::getSignature();
  if (extraout_RDX < 2) {
    value = (Expression *)0x0;
  }
  else {
    wasm::HeapType::getSignature();
    value = make(this,type_00);
  }
  pRVar1 = Builder::makeReturn(&this->builder,value);
  return (Expression *)pRVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeReturn(Type type) {
  return builder.makeReturn(funcContext->func->getResults().isConcrete()
                              ? make(funcContext->func->getResults())
                              : nullptr);
}